

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv_os_environ(uv_env_item_t **envitems,int *count)

{
  long lVar1;
  int iVar2;
  uv_env_item_t *puVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 uVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  size_t __nmemb;
  
  *envitems = (uv_env_item_t *)0x0;
  *count = 0;
  __nmemb = 0xffffffffffffffff;
  do {
    lVar1 = __nmemb * 8;
    __nmemb = __nmemb + 1;
  } while (*(long *)(_environ + lVar1 + 8) != 0);
  puVar3 = (uv_env_item_t *)uv__calloc(__nmemb,0x10);
  *envitems = puVar3;
  if (__nmemb == 0) {
    uVar9 = 0;
    iVar2 = 0;
switchD_0017f90d_caseD_5:
    *count = uVar9;
    return iVar2;
  }
  sVar7 = 0;
  uVar9 = 0;
LAB_0017f88c:
  pcVar4 = *(char **)(_environ + sVar7 * 8);
  if (pcVar4 == (char *)0x0) {
    uVar6 = 5;
  }
  else {
    pcVar4 = uv__strdup(pcVar4);
    if (pcVar4 == (char *)0x0) {
      uVar6 = 8;
    }
    else {
      pcVar5 = strchr(pcVar4,0x3d);
      if (pcVar5 == (char *)0x0) {
        uv__free(pcVar4);
        uVar6 = 7;
      }
      else {
        *pcVar5 = '\0';
        puVar3 = *envitems;
        puVar3[(int)uVar9].name = pcVar4;
        puVar3[(int)uVar9].value = pcVar5 + 1;
        uVar9 = uVar9 + 1;
        uVar6 = 0;
      }
    }
  }
  iVar2 = 0;
  switch(uVar6) {
  case 0:
  case 7:
    break;
  default:
    return 0;
  case 5:
    goto switchD_0017f90d_caseD_5;
  case 8:
    if (0 < (int)uVar9) {
      uVar8 = (ulong)uVar9;
      do {
        uv__free((*envitems)[uVar8].name);
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    uv__free(*envitems);
    *envitems = (uv_env_item_t *)0x0;
    iVar2 = -0xc;
    uVar9 = 0;
    goto switchD_0017f90d_caseD_5;
  }
  sVar7 = sVar7 + 1;
  if (__nmemb == sVar7) goto switchD_0017f90d_caseD_5;
  goto LAB_0017f88c;
}

Assistant:

int uv_os_environ(uv_env_item_t** envitems, int* count) {
  int i, j, cnt;
  uv_env_item_t* envitem;

  *envitems = NULL;
  *count = 0;

  for (i = 0; environ[i] != NULL; i++);

  *envitems = uv__calloc(i, sizeof(**envitems));

  if (envitems == NULL)
    return UV_ENOMEM;

  for (j = 0, cnt = 0; j < i; j++) {
    char* buf;
    char* ptr;

    if (environ[j] == NULL)
      break;

    buf = uv__strdup(environ[j]);
    if (buf == NULL)
      goto fail;

    ptr = strchr(buf, '=');
    if (ptr == NULL) {
      uv__free(buf);
      continue;
    }

    *ptr = '\0';

    envitem = &(*envitems)[cnt];
    envitem->name = buf;
    envitem->value = ptr + 1;

    cnt++;
  }

  *count = cnt;
  return 0;

fail:
  for (i = 0; i < cnt; i++) {
    envitem = &(*envitems)[cnt];
    uv__free(envitem->name);
  }
  uv__free(*envitems);

  *envitems = NULL;
  *count = 0;
  return UV_ENOMEM;
}